

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

void translateRegister(MCInst *mcInst,Reg reg)

{
  byte local_e8 [7];
  uint8_t llvmRegnum;
  uint8_t llvmRegnums [212];
  Reg reg_local;
  MCInst *mcInst_local;
  
  llvmRegnums._204_4_ = reg;
  unique0x10000066 = mcInst;
  memcpy(local_e8,&DAT_00262eb0,0xd4);
  MCOperand_CreateReg0(stack0xfffffffffffffff0,(uint)local_e8[(uint)llvmRegnums._204_4_]);
  return;
}

Assistant:

static void translateRegister(MCInst *mcInst, Reg reg)
{
#define ENTRY(x) X86_##x,
	uint8_t llvmRegnums[] = {
		ALL_REGS
			0
	};
#undef ENTRY

	uint8_t llvmRegnum = llvmRegnums[reg];
	MCOperand_CreateReg0(mcInst, llvmRegnum);
}